

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

ON_String __thiscall
ON_String::ToBIG5(ON_String *this,char *buffer,int buffer_length,int *error_count)

{
  ON__UINT32 OVar1;
  bool bVar2;
  ON_Big5CodePoint OVar3;
  Encoding EVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int i;
  uint uVar9;
  ulong uVar10;
  int buffer_length_00;
  size_t slen;
  ulong uVar11;
  ON_Big5UnicodePair key;
  ON_Big5UnicodePair pair;
  ON__UINT32 unicode_code_point;
  ON_Big5UnicodePair local_7c;
  ON_Big5UnicodePair local_78;
  ON__UINT32 local_74;
  int local_70;
  int local_6c;
  ON_String *local_68;
  int local_5c;
  ON_SimpleArray<ON_Big5UnicodePair> *local_58;
  char *local_50;
  char *local_48;
  ON_UnicodeErrorParameters local_40;
  
  uVar11 = (ulong)(uint)buffer_length;
  if (error_count != (int *)0x0) {
    *error_count = 0;
  }
  if (buffer != (char *)0x0) {
    if (buffer_length == -1) {
      uVar11 = 0;
      do {
        if (buffer[uVar11] == '\0') goto LAB_005b7ed7;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x7ffffffd);
      uVar11 = 0x7ffffffd;
    }
LAB_005b7ed7:
    buffer_length_00 = (int)uVar11;
    if (0 < buffer_length_00) {
      EVar4 = ProbableEncoding(buffer,buffer_length_00);
      if (EVar4 - UTF8 < 2) {
        local_58 = ON_Big5UnicodePair::UnicodeToBig5();
        ON_String(this);
        local_68 = this;
        local_50 = ReserveArray(this,(ulong)(buffer_length_00 * 2 + 1));
        local_5c = buffer_length_00 * 2;
        uVar11 = 0;
        iVar7 = -1;
        uVar10 = 0;
        local_6c = 0;
        local_70 = 0;
        local_48 = buffer;
        do {
          local_40.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
          local_40.m_error_mask = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
          local_40.m_error_code_point = 0x110000;
          local_74 = 0x110000;
          iVar5 = ON_DecodeUTF8(buffer + uVar10,buffer_length_00 - (int)uVar10,&local_40,&local_74);
          local_78 = ON_Big5UnicodePair::Error;
          if ((0 < iVar5) && (bVar2 = ON_IsStandardUnicodeCodePoint(local_74), bVar2)) {
            if (local_74 < 0x80) {
              local_78 = ON_Big5UnicodePair::Create(local_74,local_74);
            }
            else {
              local_7c = ON_Big5UnicodePair::Create(0,local_74);
              OVar1 = local_74;
              uVar9 = ON_Big5UnicodePair::UnicodeCodePoint(&local_7c);
              buffer = local_48;
              if ((OVar1 == uVar9) &&
                 (uVar9 = ON_SimpleArray<ON_Big5UnicodePair>::BinarySearch
                                    (local_58,&local_7c,ON_Big5UnicodePair::CompareUnicodeCodePoint)
                 , -1 < (int)uVar9)) {
                local_78 = local_58->m_a[uVar9];
              }
            }
          }
          bVar2 = ON_Big5UnicodePair::IsValid(&local_78,true,true);
          iVar8 = (int)uVar11;
          if (bVar2) {
            OVar3 = ON_Big5UnicodePair::Big5(&local_78);
            local_7c.m_big5.m_big5_code_point = OVar3.m_big5_code_point;
            iVar6 = ON_Big5CodePoint::Encode
                              (&local_7c.m_big5,local_50 + iVar8,(long)(local_5c - iVar8));
            if (1 < iVar6 - 1U) goto LAB_005b807d;
            local_70 = local_70 + (uint)(iVar6 == 2);
          }
          else {
LAB_005b807d:
            local_50[uVar11] = '?';
            local_6c = local_6c + 1;
            iVar6 = 1;
          }
          this = local_68;
          if (iVar5 < 2) {
            iVar5 = 1;
          }
          uVar11 = (ulong)(uint)(iVar8 + iVar6);
          uVar9 = (int)uVar10 + iVar5;
          uVar10 = (ulong)uVar9;
          iVar7 = iVar7 + 1;
        } while ((int)uVar9 < buffer_length_00);
        if ((0 < local_70) && (local_6c * 2 <= iVar7)) {
          SetLength(local_68,uVar11);
          return (ON_String)(char *)this;
        }
        ~ON_String(local_68);
      }
      else if ((EVar4 == BIG5andASCII) || (EVar4 == ASCII)) {
        ON_String(this,buffer,buffer_length_00);
        return (ON_String)(char *)this;
      }
    }
  }
  ON_String(this,&EmptyString);
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToBIG5(
  const char* buffer,
  int buffer_length,
  int* error_count
)
{
  if (nullptr != error_count)
    *error_count = 0;

  if (nullptr == buffer)
    return ON_String::EmptyString;

  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0 || buffer_length > ON_String::MaximumStringLength)
    return ON_String::EmptyString;

  switch (ON_String::ProbableEncoding(buffer,buffer_length))
  {
  case ON_String::Encoding::ASCII:
  case ON_String::Encoding::BIG5andASCII:
    return ON_String(buffer,buffer_length);
    break;

  case ON_String::Encoding::UTF8:
  case ON_String::Encoding::SloppyUTF8:
  {
    const ON_SimpleArray< ON_Big5UnicodePair>& unicode_to_big5 = ON_Big5UnicodePair::UnicodeToBig5();

    const int big5_capacity = 2 * buffer_length;
    int big5_len = 0;
    ON_String big5;
    char* big5_buffer = big5.ReserveArray(big5_capacity + 1);

    int code_point_count = 0;
    int big5_code_point_count = 0;
    int fail_count = 0;
    int delta_i = 0;
    for (int i = 0; i < buffer_length; i += (delta_i > 0 ? delta_i : 1))
    {
      ON_UnicodeErrorParameters e = ON_UnicodeErrorParameters::MaskErrors;
      e.m_error_code_point = ON_UnicodeCodePoint::ON_InvalidCodePoint;
      ON__UINT32 unicode_code_point = e.m_error_code_point;
      delta_i = ON_DecodeUTF8(
        buffer + i,
        buffer_length - i,
        &e,
        &unicode_code_point
      );
      ++code_point_count;

      ON_Big5UnicodePair pair = ON_Big5UnicodePair::Error;
      for (;;)
      {
        if (delta_i <= 0)
          break;
        if (false == ON_IsStandardUnicodeCodePoint(unicode_code_point))
          break;

        if (unicode_code_point >= 0 && unicode_code_point <= 0x7F)
        {
          // ASCII code point.
          pair = ON_Big5UnicodePair::Create(unicode_code_point, unicode_code_point);
          break;
        }

        const ON_Big5UnicodePair key = ON_Big5UnicodePair::Create(0, unicode_code_point);
        if (unicode_code_point != key.UnicodeCodePoint())
          break;
        const int k = unicode_to_big5.BinarySearch(&key, ON_Big5UnicodePair::CompareUnicodeCodePoint);
        if (k < 0)
          break;

        // BIG5 code point
        pair = unicode_to_big5[k];
        break;
      }

      const int big5_delta = pair.IsValid(true, true) ? pair.Big5().Encode(big5_buffer + big5_len, big5_capacity - big5_len) : 0;
      if (1 == big5_delta || 2 == big5_delta)
      {
        if (2 == big5_delta)
          ++big5_code_point_count;
        big5_len += big5_delta;
      }
      else
      {
        big5_buffer[big5_len++] = '?';
        ++fail_count;
      }
    }
    if (big5_code_point_count > 0 && 2 * fail_count < code_point_count)
    {
      big5.SetLength(big5_len);
      return big5;
    }
  }
  break;

  default:
    break;
  }
  return ON_String::EmptyString;
}